

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gfxwrapper_opengl.c
# Opt level: O1

ksGpuSurfaceBits
ksGpuContext_BitsForSurfaceFormat
          (ksGpuSurfaceColorFormat colorFormat,ksGpuSurfaceDepthFormat depthFormat)

{
  byte bVar1;
  byte bVar2;
  ksGpuSurfaceColorFormat kVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  
  kVar3 = colorFormat & ~KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5;
  bVar1 = 8;
  bVar2 = 8;
  if (kVar3 != KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8) {
    if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5) {
      bVar2 = 5;
    }
    else {
      bVar2 = (colorFormat != KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) * '\x03' + 5;
    }
  }
  if (kVar3 != KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8) {
    if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5) {
      bVar1 = 6;
    }
    else {
      bVar1 = (colorFormat != KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) * '\x02' + 6;
    }
  }
  bVar6 = 8;
  bVar7 = 8;
  if (kVar3 != KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8) {
    if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5) {
      bVar7 = 5;
    }
    else {
      bVar7 = (colorFormat != KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) * '\x03' + 5;
    }
  }
  if (kVar3 != KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8) {
    if (colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5) {
      bVar6 = 0;
    }
    else {
      bVar6 = (colorFormat != KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) << 3;
    }
  }
  uVar5 = 0x180000000000;
  if (depthFormat != KS_GPU_SURFACE_DEPTH_FORMAT_D24) {
    uVar5 = 0;
  }
  uVar4 = 0x100000000000;
  if (depthFormat != KS_GPU_SURFACE_DEPTH_FORMAT_D16) {
    uVar4 = uVar5;
  }
  return (ksGpuSurfaceBits)
         ((uint6)bVar2 |
         (uint6)bVar1 << 8 |
         (uint6)bVar7 << 0x10 |
         (uint6)bVar6 << 0x18 | (uint6)(byte)(bVar7 + bVar6 + bVar1 + bVar2) << 0x20 | (uint6)uVar4)
  ;
}

Assistant:

ksGpuSurfaceBits ksGpuContext_BitsForSurfaceFormat(const ksGpuSurfaceColorFormat colorFormat,
                                                   const ksGpuSurfaceDepthFormat depthFormat) {
    ksGpuSurfaceBits bits;
    bits.redBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                        ? 8
                        : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                               ? 8
                               : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                      ? 5
                                      : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 5 : 8))));
    bits.greenBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                          ? 8
                          : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                                 ? 8
                                 : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                        ? 6
                                        : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 6 : 8))));
    bits.blueBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                         ? 8
                         : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                                ? 8
                                : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                       ? 5
                                       : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 5 : 8))));
    bits.alphaBits = ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R8G8B8A8)
                          ? 8
                          : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B8G8R8A8)
                                 ? 8
                                 : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_R5G6B5)
                                        ? 0
                                        : ((colorFormat == KS_GPU_SURFACE_COLOR_FORMAT_B5G6R5) ? 0 : 8))));
    bits.colorBits = bits.redBits + bits.greenBits + bits.blueBits + bits.alphaBits;
    bits.depthBits =
        ((depthFormat == KS_GPU_SURFACE_DEPTH_FORMAT_D16) ? 16 : ((depthFormat == KS_GPU_SURFACE_DEPTH_FORMAT_D24) ? 24 : 0));
    return bits;
}